

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint huffmanDecodeSymbol(uchar *in,size_t *bp,HuffmanTree *codetree,size_t inbitlength)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  uint uVar4;
  
  sVar3 = *bp;
  uVar4 = 0;
  while( true ) {
    if (inbitlength <= sVar3) {
      return 0xffffffff;
    }
    uVar1 = codetree->tree2d[(uint)((in[sVar3 >> 3] >> ((uint)sVar3 & 7) & 1) != 0) + uVar4 * 2];
    sVar3 = sVar3 + 1;
    *bp = sVar3;
    uVar2 = codetree->numcodes;
    uVar4 = uVar1 - uVar2;
    if (uVar1 < uVar2) break;
    if (uVar2 <= uVar4) {
      return 0xffffffff;
    }
  }
  return uVar1;
}

Assistant:

static unsigned huffmanDecodeSymbol(const unsigned char* in, size_t* bp,
                                    const HuffmanTree* codetree, size_t inbitlength)
{
  unsigned treepos = 0, ct;
  for(;;)
  {
    if(*bp >= inbitlength) return (unsigned)(-1); /*error: end of input memory reached without endcode*/
    /*
    decode the symbol from the tree. The "readBitFromStream" code is inlined in
    the expression below because this is the biggest bottleneck while decoding
    */
    ct = codetree->tree2d[(treepos << 1) + READBIT(*bp, in)];
    ++(*bp);
    if(ct < codetree->numcodes) return ct; /*the symbol is decoded, return it*/
    else treepos = ct - codetree->numcodes; /*symbol not yet decoded, instead move tree position*/

    if(treepos >= codetree->numcodes) return (unsigned)(-1); /*error: it appeared outside the codetree*/
  }
}